

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Track::ParseContentEncodingsEntry(Track *this,longlong start,longlong size)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  ContentEncoding *this_00;
  long in_RDX;
  long in_RSI;
  longlong *in_RDI;
  IMkvReader *in_stack_00000010;
  longlong in_stack_00000018;
  longlong in_stack_00000020;
  ContentEncoding *in_stack_00000028;
  ContentEncoding *content_encoding;
  long status_1;
  longlong size_2;
  longlong id_1;
  long status;
  longlong size_1;
  longlong id;
  longlong count;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  ContentEncoding *in_stack_ffffffffffffff58;
  ContentEncoding *pCVar7;
  longlong in_stack_ffffffffffffff68;
  longlong *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  long local_68;
  ContentEncoding *in_stack_ffffffffffffffa0;
  long local_50;
  long local_48;
  ulong local_40;
  long local_30;
  
  lVar3 = in_RSI + in_RDX;
  local_40 = 0;
  local_30 = in_RSI;
  while( true ) {
    if (lVar3 <= local_30) {
      if ((long)local_40 < 1) {
        return -1;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_40;
      uVar5 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar5,(nothrow_t *)&std::nothrow);
      in_RDI[0x16] = (longlong)pvVar6;
      if (in_RDI[0x16] != 0) {
        in_RDI[0x17] = in_RDI[0x16];
        local_30 = in_RSI;
        while( true ) {
          if (lVar3 <= local_30) {
            if (local_30 != lVar3) {
              return -2;
            }
            return 0;
          }
          lVar4 = ParseElementHeader((IMkvReader *)
                                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI,
                                     (longlong *)in_stack_ffffffffffffff58);
          if (lVar4 < 0) break;
          if (in_stack_ffffffffffffffa0 == (ContentEncoding *)0x6240) {
            this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
            in_stack_ffffffffffffff7f = 0;
            pCVar7 = (ContentEncoding *)0x0;
            if (this_00 != (ContentEncoding *)0x0) {
              in_stack_ffffffffffffff7f = 1;
              ContentEncoding::ContentEncoding(this_00);
              pCVar7 = this_00;
            }
            if (pCVar7 == (ContentEncoding *)0x0) {
              return -1;
            }
            in_stack_ffffffffffffff58 = pCVar7;
            lVar4 = ContentEncoding::ParseContentEncodingEntry
                              (in_stack_00000028,in_stack_00000020,in_stack_00000018,
                               in_stack_00000010);
            if (lVar4 != 0) {
              if (pCVar7 == (ContentEncoding *)0x0) {
                return lVar4;
              }
              ContentEncoding::~ContentEncoding(in_stack_ffffffffffffffa0);
              operator_delete(pCVar7);
              return lVar4;
            }
            puVar1 = (undefined8 *)in_RDI[0x17];
            in_RDI[0x17] = (longlong)(puVar1 + 1);
            *puVar1 = pCVar7;
          }
          local_30 = local_68 + local_30;
          if (lVar3 < local_30) {
            return -2;
          }
        }
        return lVar4;
      }
      return -1;
    }
    lVar4 = ParseElementHeader((IMkvReader *)
                               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI,
                               (longlong *)in_stack_ffffffffffffff58);
    if (lVar4 < 0) {
      return lVar4;
    }
    if ((local_48 == 0x6240) && (local_40 = local_40 + 1, 0x7fffffff < (long)local_40)) break;
    local_30 = local_50 + local_30;
    if (lVar3 < local_30) {
      return -2;
    }
  }
  return -1;
}

Assistant:

long Track::ParseContentEncodingsEntry(long long start, long long size) {
  IMkvReader* const pReader = m_pSegment->m_pReader;
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentEncoding elements.
  long long count = 0;
  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (count <= 0)
    return -1;

  content_encoding_entries_ =
      new (std::nothrow) ContentEncoding*[static_cast<size_t>(count)];
  if (!content_encoding_entries_)
    return -1;

  content_encoding_entries_end_ = content_encoding_entries_;

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ContentEncoding* const content_encoding =
          new (std::nothrow) ContentEncoding();
      if (!content_encoding)
        return -1;

      status = content_encoding->ParseContentEncodingEntry(pos, size, pReader);
      if (status) {
        delete content_encoding;
        return status;
      }

      *content_encoding_entries_end_++ = content_encoding;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}